

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O2

CURLcode Curl_input_ntlm(Curl_easy *data,_Bool proxy,char *header)

{
  uchar *puVar1;
  long lVar2;
  char cVar3;
  connectdata *conn;
  curl_trc_feat *pcVar4;
  int iVar5;
  CURLcode CVar6;
  undefined7 in_register_00000031;
  ntlmdata *ntlm;
  char *src;
  size_t hdrlen;
  uchar *hdr;
  bufref hdrbuf;
  
  conn = data->conn;
  ntlm = &conn->ntlm;
  if ((int)CONCAT71(in_register_00000031,proxy) != 0) {
    ntlm = &conn->proxyntlm;
  }
  iVar5 = curl_strnequal(header,"NTLM",4);
  if (iVar5 == 0) {
    return CURLE_OK;
  }
  lVar2 = (CONCAT71(in_register_00000031,proxy) & 0xffffffff) * 4;
  src = header + 4;
  do {
    cVar3 = *src;
    if ((cVar3 != '\t') && (cVar3 != ' ')) {
      if (cVar3 == '\0') goto LAB_00137d3f;
      if (3 < (byte)(cVar3 - 10U)) {
        if (cVar3 != '\0') {
          CVar6 = Curl_base64_decode(src,&hdr,&hdrlen);
          if (CVar6 != CURLE_OK) {
            return CVar6;
          }
          Curl_bufref_init(&hdrbuf);
          Curl_bufref_set(&hdrbuf,hdr,hdrlen,curl_free);
          CVar6 = Curl_auth_decode_ntlm_type2_message(data,&hdrbuf,ntlm);
          Curl_bufref_free(&hdrbuf);
          if (CVar6 != CURLE_OK) {
            return CVar6;
          }
          puVar1 = (conn->ntlm).nonce + lVar2 + -0xc;
          puVar1[0] = '\x02';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          return CURLE_OK;
        }
LAB_00137d3f:
        iVar5 = *(int *)((conn->ntlm).nonce + lVar2 + -0xc);
        if (iVar5 != 0) {
          if (iVar5 == 3) {
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
                (0 < pcVar4->log_level)))) {
              Curl_infof(data,"NTLM handshake rejected");
            }
            Curl_http_auth_cleanup_ntlm(conn);
            puVar1 = (conn->ntlm).nonce + lVar2 + -0xc;
            puVar1[0] = '\0';
            puVar1[1] = '\0';
            puVar1[2] = '\0';
            puVar1[3] = '\0';
            return CURLE_REMOTE_ACCESS_DENIED;
          }
          if (iVar5 != 4) {
            if (data == (Curl_easy *)0x0) {
              return CURLE_REMOTE_ACCESS_DENIED;
            }
            if (((data->set).field_0x8cd & 0x10) == 0) {
              return CURLE_REMOTE_ACCESS_DENIED;
            }
            pcVar4 = (data->state).feat;
            if ((pcVar4 != (curl_trc_feat *)0x0) && (pcVar4->log_level < 1)) {
              return CURLE_REMOTE_ACCESS_DENIED;
            }
            Curl_infof(data,"NTLM handshake failure (internal error)");
            return CURLE_REMOTE_ACCESS_DENIED;
          }
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
              (0 < pcVar4->log_level)))) {
            Curl_infof(data,"NTLM auth restarted");
          }
          Curl_http_auth_cleanup_ntlm(conn);
        }
        puVar1 = (conn->ntlm).nonce + lVar2 + -0xc;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        return CURLE_OK;
      }
    }
    src = src + 1;
  } while( true );
}

Assistant:

CURLcode Curl_input_ntlm(struct Curl_easy *data,
                         bool proxy,         /* if proxy or not */
                         const char *header) /* rest of the www-authenticate:
                                                header */
{
  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  curlntlm *state;
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  ntlm = proxy ? &conn->proxyntlm : &conn->ntlm;
  state = proxy ? &conn->proxy_ntlm_state : &conn->http_ntlm_state;

  if(checkprefix("NTLM", header)) {
    header += strlen("NTLM");

    while(*header && ISSPACE(*header))
      header++;

    if(*header) {
      unsigned char *hdr;
      size_t hdrlen;

      result = Curl_base64_decode(header, &hdr, &hdrlen);
      if(!result) {
        struct bufref hdrbuf;

        Curl_bufref_init(&hdrbuf);
        Curl_bufref_set(&hdrbuf, hdr, hdrlen, curl_free);
        result = Curl_auth_decode_ntlm_type2_message(data, &hdrbuf, ntlm);
        Curl_bufref_free(&hdrbuf);
      }
      if(result)
        return result;

      *state = NTLMSTATE_TYPE2; /* We got a type-2 message */
    }
    else {
      if(*state == NTLMSTATE_LAST) {
        infof(data, "NTLM auth restarted");
        Curl_http_auth_cleanup_ntlm(conn);
      }
      else if(*state == NTLMSTATE_TYPE3) {
        infof(data, "NTLM handshake rejected");
        Curl_http_auth_cleanup_ntlm(conn);
        *state = NTLMSTATE_NONE;
        return CURLE_REMOTE_ACCESS_DENIED;
      }
      else if(*state >= NTLMSTATE_TYPE1) {
        infof(data, "NTLM handshake failure (internal error)");
        return CURLE_REMOTE_ACCESS_DENIED;
      }

      *state = NTLMSTATE_TYPE1; /* We should send away a type-1 */
    }
  }

  return result;
}